

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O2

void xe::removeChildren(set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                        *nodeSet,TestGroup *group)

{
  pointer ppTVar1;
  int ndx;
  long lVar2;
  TestNode *child;
  TestGroup *local_28;
  
  for (lVar2 = 0;
      ppTVar1 = (group->m_children).
                super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(group->m_children).
                                  super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1) >> 3);
      lVar2 = lVar2 + 1) {
    local_28 = (TestGroup *)ppTVar1[lVar2];
    std::
    _Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
    ::erase(&nodeSet->_M_t,(key_type *)&local_28);
    if ((local_28->super_TestNode).m_nodeType == TESTNODETYPE_GROUP) {
      removeChildren(nodeSet,local_28);
    }
  }
  return;
}

Assistant:

static void removeChildren (std::set<const TestNode*>& nodeSet, const TestGroup* group)
{
	for (int ndx = 0; ndx < group->getNumChildren(); ndx++)
	{
		const TestNode* child = group->getChild(ndx);
		nodeSet.erase(child);

		if (child->getNodeType() == TESTNODETYPE_GROUP)
			removeChildren(nodeSet, static_cast<const TestGroup*>(child));
	}
}